

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

natwm_error parser_read_value(parser *parser,char **result,size_t *length)

{
  undefined8 in_R9;
  undefined8 uVar1;
  size_t local_58;
  size_t value_stripped_length;
  char *value_stripped;
  size_t end_pos;
  char *value;
  char *line;
  size_t *psStack_28;
  natwm_error err;
  size_t *length_local;
  char **result_local;
  parser *parser_local;
  
  uVar1 = 0x109709;
  line._4_4_ = 0x20;
  value = parser->buffer + parser->pos + 1;
  end_pos = 0;
  value_stripped = (char *)0x0;
  psStack_28 = length;
  length_local = (size_t *)result;
  result_local = &parser->buffer;
  line._4_4_ = string_get_delimiter(value,'\n',(char **)&end_pos,(size_t *)&value_stripped,false);
  if (line._4_4_ == NO_ERROR) {
    value_stripped_length = 0;
    local_58 = 0;
    line._4_4_ = string_strip_surrounding_spaces
                           ((char *)end_pos,(char **)&value_stripped_length,&local_58);
    if (line._4_4_ == NO_ERROR) {
      free((void *)end_pos);
      parser_move((parser *)result_local,(size_t)value_stripped);
      *length_local = value_stripped_length;
      if (psStack_28 != (size_t *)0x0) {
        *psStack_28 = local_58;
      }
      parser_local._4_4_ = NO_ERROR;
    }
    else {
      internal_logger(natwm_logger,LEVEL_ERROR,"Found invalid item value - Line %zu Col: %zu",
                      result_local[3],result_local[4],in_R9,uVar1);
      free((void *)end_pos);
      parser_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  else {
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to read item value - Line %zu Col: %zu",
                    result_local[3],result_local[4],in_R9,uVar1);
    parser_local._4_4_ = INVALID_INPUT_ERROR;
  }
  return parser_local._4_4_;
}

Assistant:

enum natwm_error parser_read_value(struct parser *parser, char **result, size_t *length)
{
        enum natwm_error err = GENERIC_ERROR;
        // We need to ignore the EQUAL_CHAR
        const char *line = (parser->buffer + parser->pos) + 1;
        char *value = NULL;
        size_t end_pos = 0;

        err = string_get_delimiter(line, '\n', &value, &end_pos, false);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Failed to read item value - Line %zu Col: %zu",
                          parser->line_num,
                          parser->col_num);

                return INVALID_INPUT_ERROR;
        }

        // Now we need to strip the surrounding spaces to be left with the value
        // string

        char *value_stripped = NULL;
        size_t value_stripped_length = 0;

        err = string_strip_surrounding_spaces(value, &value_stripped, &value_stripped_length);

        if (err != NO_ERROR) {
                LOG_ERROR(natwm_logger,
                          "Found invalid item value - Line %zu Col: %zu",
                          parser->line_num,
                          parser->col_num);

                free(value);

                return INVALID_INPUT_ERROR;
        }

        // Free intermediate values
        free(value);

        // Update the parser position to the end of the line
        parser_move(parser, end_pos);

        *result = value_stripped;

        SET_IF_NON_NULL(length, value_stripped_length);

        return NO_ERROR;
}